

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O3

parser * init_parse_summon(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_summon_name);
  parser_reg(p,"msgt sym type",parse_summon_message_type);
  parser_reg(p,"uniques int allowed",parse_summon_unique);
  parser_reg(p,"base sym base",parse_summon_base);
  parser_reg(p,"race-flag sym flag",parse_summon_race_flag);
  parser_reg(p,"fallback str fallback",parse_summon_fallback);
  parser_reg(p,"desc str desc",parse_summon_desc);
  return p;
}

Assistant:

static struct parser *init_parse_summon(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);

	parser_reg(p, "name str name", parse_summon_name);
	parser_reg(p, "msgt sym type", parse_summon_message_type);
	parser_reg(p, "uniques int allowed", parse_summon_unique);
	parser_reg(p, "base sym base", parse_summon_base);
	parser_reg(p, "race-flag sym flag", parse_summon_race_flag);
	parser_reg(p, "fallback str fallback", parse_summon_fallback);
	parser_reg(p, "desc str desc", parse_summon_desc);
	return p;
}